

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr Term_redraw_section(wchar_t x1,wchar_t y1,wchar_t x2,wchar_t y2)

{
  int *piVar1;
  int *piVar2;
  wchar_t **ppwVar3;
  term *ptVar4;
  wchar_t wVar5;
  ulong uVar6;
  wchar_t wVar7;
  ulong uVar8;
  long lVar9;
  
  ptVar4 = Term;
  wVar5 = Term->hgt + L'\xffffffff';
  if (y2 < Term->hgt) {
    wVar5 = y2;
  }
  wVar7 = Term->wid + L'\xffffffff';
  if (x2 < Term->wid) {
    wVar7 = x2;
  }
  uVar8 = (ulong)(uint)y1;
  if (y1 < L'\x01') {
    uVar8 = 0;
  }
  Term->y1 = (wchar_t)uVar8;
  ptVar4->y2 = wVar5;
  if ((wchar_t)uVar8 <= wVar5) {
    uVar6 = (ulong)(uint)x1;
    if (x1 < L'\x01') {
      uVar6 = 0;
    }
    piVar1 = ptVar4->x1;
    piVar2 = ptVar4->x2;
    ppwVar3 = ptVar4->old->c;
    lVar9 = uVar8 - 1;
    do {
      if (0 < (int)uVar6) {
        uVar6 = (ulong)((int)uVar6 - (uint)(ptVar4->old->a[lVar9 + 1][uVar6] == 0xff));
      }
      wVar5 = (wchar_t)uVar6;
      piVar1[lVar9 + 1] = wVar5;
      piVar2[lVar9 + 1] = wVar7;
      if (wVar5 <= wVar7) {
        memset(ppwVar3[lVar9 + 1] + wVar5,0,(ulong)(uint)(wVar7 - wVar5) * 4 + 4);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < ptVar4->y2);
  }
  Term_fresh();
  return 0;
}

Assistant:

errr Term_redraw_section(int x1, int y1, int x2, int y2)
{
	int i, j;

	wchar_t *c_ptr;

	/* Bounds checking */
	if (y2 >= Term->hgt) y2 = Term->hgt - 1;
	if (x2 >= Term->wid) x2 = Term->wid - 1;
	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;


	/* Set y limits */
	Term->y1 = y1;
	Term->y2 = y2;

	/* Set the x limits */
	for (i = Term->y1; i <= Term->y2; i++) {
		if ((x1 > 0) && (Term->old->a[i][x1] == 255))
			x1--;

		Term->x1[i] = x1;
		Term->x2[i] = x2;

		c_ptr = Term->old->c[i];

		/* Clear the section so it is redrawn */
		for (j = x1; j <= x2; j++) {
			/* Hack - set the old character to "none" */
			c_ptr[j] = 0;
		}
	}

	/* Hack -- Refresh */
	Term_fresh();

	/* Success */
	return (0);
}